

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void draw_h_arrow(int x1,int y,int x2)

{
  int iVar1;
  int dx;
  int x2_local;
  int y_local;
  int x1_local;
  
  iVar1 = 1;
  if (x2 < x1) {
    iVar1 = -1;
  }
  fl_xyline(x1,y,x2);
  fl_yxline(x2,y + -4,y + 4);
  fl_line(x2 + iVar1 * -5,y + -2,x2 - iVar1,y);
  fl_line(x2 + iVar1 * -5,y + 2,x2 - iVar1,y);
  return;
}

Assistant:

static void draw_h_arrow(int x1, int y, int x2) {
  int dx = (x1>x2) ? -1 : 1 ;
  fl_xyline(x1, y, x2);
  fl_yxline(x2, y-4, y+4);
  fl_line(x2-dx*5, y-2, x2-dx, y);
  fl_line(x2-dx*5, y+2, x2-dx, y);
}